

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void auxsetstr(lua_State *L,TValue *t,char *k)

{
  StkId pSVar1;
  TString *key;
  int local_44;
  TString *x_;
  TValue *io;
  TString *str;
  int hres;
  char *k_local;
  TValue *t_local;
  lua_State *L_local;
  
  key = luaS_new(L,k);
  if (t->tt_ == 'E') {
    local_44 = luaH_psetstr((Table *)(t->value_).gc,key,(TValue *)((L->top).offset + -0x10));
  }
  else {
    local_44 = 2;
  }
  if (local_44 == 0) {
    if ((((*(byte *)((L->top).offset + -8) & 0x40) != 0) && ((((t->value_).gc)->marked & 0x20) != 0)
        ) && ((*(byte *)(*(long *)((L->top).offset + -0x10) + 9) & 0x18) != 0)) {
      luaC_barrierback_(L,(t->value_).gc);
    }
    (L->top).p = (StkId)((L->top).offset + -0x10);
  }
  else {
    pSVar1 = (L->top).p;
    *(TString **)pSVar1 = key;
    (pSVar1->val).tt_ = key->tt | 0x40;
    (L->top).p = (StkId)((L->top).offset + 0x10);
    luaV_finishset(L,t,(TValue *)((L->top).offset + -0x10),(TValue *)((L->top).offset + -0x20),
                   local_44);
    (L->top).p = (StkId)((L->top).offset + -0x20);
  }
  return;
}

Assistant:

static void auxsetstr (lua_State *L, const TValue *t, const char *k) {
  int hres;
  TString *str = luaS_new(L, k);
  api_checkpop(L, 1);
  luaV_fastset(t, str, s2v(L->top.p - 1), hres, luaH_psetstr);
  if (hres == HOK) {
    luaV_finishfastset(L, t, s2v(L->top.p - 1));
    L->top.p--;  /* pop value */
  }
  else {
    setsvalue2s(L, L->top.p, str);  /* push 'str' (to make it a TValue) */
    api_incr_top(L);
    luaV_finishset(L, t, s2v(L->top.p - 1), s2v(L->top.p - 2), hres);
    L->top.p -= 2;  /* pop value and key */
  }
  lua_unlock(L);  /* lock done by caller */
}